

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O2

void bench_compute_response_layer
               (vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_> *functions
               ,integral_image *iimage,vector<benchmark_data,_std::allocator<benchmark_data>_> *data
               )

{
  fasthessian *fh;
  long lVar1;
  int j;
  ulong uVar2;
  
  fh = create_fast_hessian(iimage);
  create_response_map(fh);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (ulong)(*(long *)(functions + 8) - *(long *)functions >> 3);
      uVar2 = uVar2 + 1) {
    perf_compute_response_all_layers
              (*(_func_void_fasthessian_ptr **)(*(long *)functions + uVar2 * 8),fh,
               (benchmark_data *)(*(long *)data + lVar1));
    lVar1 = lVar1 + 0x238;
  }
  for (lVar1 = 1; lVar1 != 5; lVar1 = lVar1 + 1) {
    free(fh->response_map[lVar1 + -1]->response);
    free(fh->response_map[lVar1 + -1]->laplacian);
    free(fh->response_map[lVar1 + -1]);
  }
  free(fh);
  return;
}

Assistant:

void bench_compute_response_layer(const std::vector<void (*)(struct fasthessian *)> &functions,
                                  struct integral_image *iimage, std::vector<struct benchmark_data> &data) {
    // TODO: (carla) do we need a new fast hessian for every function?
    struct fasthessian *fh = create_fast_hessian(iimage);
    // Create octaves with response layers
    create_response_map(fh);

    assert(functions.size() == data.size());

    for (int j = 0; j < functions.size(); ++j) {
        perf_compute_response_all_layers(functions[j], fh, data[j]);
    }
    for (int i = 0; i < NUM_LAYERS; ++i) {
        free(fh->response_map[i]->response);
        free(fh->response_map[i]->laplacian);
        free(fh->response_map[i]);
    }
    free(fh);
}